

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O3

void __thiscall PreciseMeasurement_unaryOps_Test::TestBody(PreciseMeasurement_unaryOps_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar;
  precise_measurement x;
  precise_measurement y;
  internal local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  precise_unit local_58;
  precise_unit local_48;
  precise_measurement local_38;
  precise_measurement local_20;
  
  local_38.value_ = 2.0;
  local_38.units_.multiplier_ = (double)0x3f847ae147ae147b;
  local_38.units_.base_units_ = (unit_data)0x1;
  local_38.units_.commodity_ = 0;
  local_20.value_ = 2.0;
  local_20.units_.multiplier_ = (double)0x3f847ae147ae147b;
  local_20.units_.base_units_ = (unit_data)0x1;
  local_20.units_.commodity_ = 0;
  testing::internal::CmpHelperEQ<units::precise_measurement,units::precise_measurement>
            (local_68,"y","x",&local_20,&local_38);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1f1,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if ((long *)local_48.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_48.multiplier_ + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  local_48.multiplier_ = -2.0;
  local_58.multiplier_ = -local_38.value_;
  testing::internal::CmpHelperEQ<double,double>
            (local_68,"z.value()","-x.value()",&local_48.multiplier_,&local_58.multiplier_);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1f2,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if ((long *)local_48.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_48.multiplier_ + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  local_48.multiplier_ = (double)&DAT_3f847ae147ae147b;
  local_48.base_units_ = (unit_data)0x1;
  local_48.commodity_ = 0;
  local_58.multiplier_ = local_38.units_.multiplier_;
  local_58.base_units_ = local_38.units_.base_units_;
  local_58.commodity_ = local_38.units_.commodity_;
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            (local_68,"z.units()","x.units()",&local_48,&local_58);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,499,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if ((long *)local_48.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_48.multiplier_ + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  return;
}

Assistant:

TEST(PreciseMeasurement, unaryOps)
{
    precise_measurement x(2.0, precise::cm);

    auto z = -x;
    auto y = +x;
    EXPECT_EQ(y, x);
    EXPECT_EQ(z.value(), -x.value());
    EXPECT_EQ(z.units(), x.units());
}